

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

void __thiscall nivalis::Plotter::move_func(Plotter *this,size_t idx,size_t idx_dest)

{
  ulong uVar1;
  Function *__a;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = idx - idx_dest;
  if (lVar3 == 0) {
    return;
  }
  uVar4 = -(ulong)(idx_dest < idx) | 1;
  uVar1 = this->curr_func;
  if (uVar1 != idx) {
    if ((uVar1 <= idx || idx_dest < uVar1) && (uVar1 < idx_dest || idx <= uVar1)) goto LAB_00125ff3;
    idx_dest = uVar1 - uVar4;
  }
  this->curr_func = idx_dest;
LAB_00125ff3:
  lVar2 = idx * 0x130;
  for (; lVar3 != 0; lVar3 = lVar3 + uVar4) {
    __a = (Function *)
          ((long)(((this->funcs).
                   super__Vector_base<nivalis::Function,_std::allocator<nivalis::Function>_>._M_impl
                   .super__Vector_impl_data._M_start)->line_color).data + lVar2 + -0x20);
    std::swap<nivalis::Function>(__a,__a + uVar4);
    lVar2 = lVar2 + uVar4 * 0x130;
  }
  this->require_update = true;
  return;
}

Assistant:

void Plotter::move_func(size_t idx, size_t idx_dest) {
    if (idx == idx_dest) return;
    int64_t step = idx > idx_dest ? -1 : 1;
    if (curr_func == idx) curr_func = idx_dest;
    else if (idx < curr_func && curr_func <= idx_dest ||
            idx > curr_func && curr_func >= idx_dest) {
        curr_func -= step;
    }
    for (size_t i = idx; i != idx_dest; i += step) {
        size_t j = i + step;
        std::swap(funcs[i], funcs[j]);
    }
    require_update = true;
}